

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

void __thiscall adios2::IO::ClearParameters(IO *this)

{
  IO *pointer;
  string local_40;
  
  pointer = this->m_IO;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"in call to IO::ClearParameters","");
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  adios2::core::IO::ClearParameters();
  return;
}

Assistant:

void IO::ClearParameters()
{
    helper::CheckForNullptr(m_IO, "in call to IO::ClearParameters");
    m_IO->ClearParameters();
}